

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O0

int __thiscall embree::LinearBarrierActive::init(LinearBarrierActive *this,EVP_PKEY_CTX *ctx)

{
  uchar *puVar1;
  size_t i_1;
  size_t i;
  EVP_PKEY_CTX *local_20;
  EVP_PKEY_CTX *local_18;
  
  if ((EVP_PKEY_CTX *)this->threadCount != ctx) {
    this->threadCount = (size_t)ctx;
    if ((this->count0 != (uchar *)0x0) && (this->count0 != (uchar *)0x0)) {
      operator_delete__(this->count0);
    }
    puVar1 = (uchar *)operator_new__((ulong)ctx);
    this->count0 = puVar1;
    if ((this->count1 != (uchar *)0x0) && (this->count1 != (uchar *)0x0)) {
      operator_delete__(this->count1);
    }
    puVar1 = (uchar *)operator_new__((ulong)ctx);
    this->count1 = puVar1;
  }
  this->mode = 0;
  this->flag0 = 0;
  this->flag1 = 0;
  for (local_18 = (EVP_PKEY_CTX *)0x0; local_18 < ctx; local_18 = local_18 + 1) {
    local_18[(long)this->count0] = (EVP_PKEY_CTX)0x0;
  }
  for (local_20 = (EVP_PKEY_CTX *)0x0; local_20 < ctx; local_20 = local_20 + 1) {
    this->count1[(long)local_20] = '\0';
  }
  return (int)local_20;
}

Assistant:

void LinearBarrierActive::init(size_t N) 
  {
    if (threadCount != N) {
      threadCount = N;
      if (count0) delete[] count0; count0 = new unsigned char[N];
      if (count1) delete[] count1; count1 = new unsigned char[N];
    }
    mode      = 0;
    flag0     = 0;
    flag1     = 0;
    for (size_t i=0; i<N; i++) count0[i] = 0;
    for (size_t i=0; i<N; i++) count1[i] = 0;
  }